

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall
GlobOpt::InsertCloneStrs
          (GlobOpt *this,BasicBlock *toBlock,GlobOptBlockData *toData,GlobOptBlockData *fromData)

{
  Type TVar1;
  Loop *pLVar2;
  BasicBlock *this_00;
  SymTable *this_01;
  ValueInfo *pVVar3;
  Func *func;
  Instr *this_02;
  Type pJVar4;
  Type pBVar5;
  code *pcVar6;
  bool bVar7;
  BOOLEAN BVar8;
  byte bVar9;
  BVSparse<Memory::JitArenaAllocator> *pBVar10;
  undefined4 *puVar11;
  StackSym *sym;
  Value *pVVar12;
  Value *pVVar13;
  Instr *this_03;
  RegOpnd *newDst;
  BVSparse<Memory::JitArenaAllocator> *pBVar14;
  Type_conflict pBVar15;
  SymID id;
  Type_conflict pBVar16;
  BVSparse<Memory::JitArenaAllocator> *this_04;
  ulong uVar17;
  ulong uVar18;
  
  if ((((toBlock->field_0x18 & 4) != 0) &&
      (pBVar14 = toBlock->cloneStrCandidates, pBVar14 != (BVSparse<Memory::JitArenaAllocator> *)0x0)
      ) && (this->prePassLoop == (Loop *)0x0)) {
    pLVar2 = toBlock->loop;
    this_00 = pLVar2->landingPad;
    this_04 = this->tempBv;
    this_01 = this->func->m_symTable;
    pBVar10 = this_04;
    do {
      pBVar10 = (BVSparse<Memory::JitArenaAllocator> *)pBVar10->head;
      if (pBVar10 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0041ebe9;
    } while (((Type *)&pBVar10->alloc)->word == 0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x1574,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
    if (!bVar7) {
LAB_0041ef00:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar11 = 0;
    this_04 = this->tempBv;
    pBVar14 = toBlock->cloneStrCandidates;
LAB_0041ebe9:
    BVSparse<Memory::JitArenaAllocator>::And(this_04,pBVar14,fromData->isTempSrc);
    pBVar14 = this->tempBv;
    pBVar16 = pBVar14->head;
    if (pBVar16 != (Type_conflict)0x0) {
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        uVar17 = (pBVar16->data).word;
        if (uVar17 != 0) {
          TVar1 = pBVar16->startIndex;
          uVar18 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
            }
          }
          do {
            id = TVar1 + (BVIndex)uVar18;
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar18);
            sym = (StackSym *)SymTable::Find(this_01,id);
            if (sym == (StackSym *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                 ,0x1579,"(sym)","sym");
              if (!bVar7) goto LAB_0041ef00;
              *puVar11 = 0;
            }
            BVar8 = BVSparse<Memory::JitArenaAllocator>::Test((this_00->globOptData).liveVarSyms,id)
            ;
            if (((BVar8 != '\0') &&
                (BVar8 = BVSparse<Memory::JitArenaAllocator>::Test(fromData->liveVarSyms,id),
                BVar8 != '\0')) &&
               ((pVVar12 = GlobOptBlockData::FindValue(&this_00->globOptData,(Sym *)sym),
                pVVar12 != (Value *)0x0 &&
                (pVVar13 = GlobOptBlockData::FindValue(fromData,(Sym *)sym), pVVar13 != (Value *)0x0
                )))) {
              pVVar3 = pVVar13->valueInfo;
              bVar7 = ValueType::IsLikelyString(&pVVar12->valueInfo->super_ValueType);
              if ((bVar7) && (bVar7 = ValueType::IsLikelyString(&pVVar3->super_ValueType), bVar7)) {
                this_03 = IR::Instr::New(CloneStr,this->func);
                newDst = IR::RegOpnd::New(sym,TyVar,this->func);
                IR::Instr::SetDst(this_03,&newDst->super_Opnd);
                if (this_03->m_src1 != (Opnd *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar11 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                     ,0x16c,"(this->m_src1 == __null)",
                                     "Trying to overwrite existing src.");
                  if (!bVar7) goto LAB_0041ef00;
                  *puVar11 = 0;
                }
                func = this_03->m_func;
                if ((newDst->super_Opnd).isDeleted == true) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar11 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x14,"(!isDeleted)","Using deleted operand");
                  if (!bVar7) goto LAB_0041ef00;
                  *puVar11 = 0;
                }
                bVar9 = (newDst->super_Opnd).field_0xb;
                if ((bVar9 & 2) != 0) {
                  newDst = (RegOpnd *)IR::Opnd::Copy(&newDst->super_Opnd,func);
                  bVar9 = (newDst->super_Opnd).field_0xb;
                }
                (newDst->super_Opnd).field_0xb = bVar9 | 2;
                this_03->m_src1 = &newDst->super_Opnd;
                this_02 = pLVar2->bailOutInfo->bailOutInstr;
                if (this_02 == (Instr *)0x0) {
                  BasicBlock::InsertAfter(this_00,this_03);
                }
                else {
                  IR::Instr::InsertBefore(this_02,this_03);
                }
                BVSparse<Memory::JitArenaAllocator>::Set(toData->isTempSrc,id);
              }
            }
            uVar17 = uVar17 & ~(1L << (uVar18 & 0x3f));
            uVar18 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
          } while (uVar17 != 0);
        }
        pBVar16 = pBVar16->next;
      } while (pBVar16 != (Type)0x0);
      pBVar14 = this->tempBv;
      if (pBVar14->head != (Type_conflict)0x0) {
        pJVar4 = pBVar14->alloc;
        pBVar5 = pBVar14->head;
        pBVar16 = pJVar4->bvFreeList;
        do {
          pBVar15 = pBVar5;
          pBVar5 = pBVar15->next;
          pBVar15->next = pBVar16;
          pBVar16 = pBVar15;
        } while (pBVar5 != (Type)0x0);
        pJVar4->bvFreeList = pBVar15;
      }
    }
    pBVar14->head = (Type_conflict)0x0;
    pBVar14->lastFoundIndex = (Type_conflict)0x0;
    pBVar14->lastUsedNodePrevNextField = &pBVar14->head;
  }
  return;
}

Assistant:

void GlobOpt::InsertCloneStrs(BasicBlock *toBlock, GlobOptBlockData *toData, GlobOptBlockData *fromData)
{
    if (toBlock->isLoopHeader   // isLoopBackEdge
        && toBlock->cloneStrCandidates
        && !IsLoopPrePass())
    {
        Loop *loop = toBlock->loop;
        BasicBlock *landingPad = loop->landingPad;
        const SymTable *const symTable = func->m_symTable;
        Assert(tempBv->IsEmpty());
        tempBv->And(toBlock->cloneStrCandidates, fromData->isTempSrc);
        FOREACH_BITSET_IN_SPARSEBV(id, tempBv)
        {
            StackSym *const sym = (StackSym *)symTable->Find(id);
            Assert(sym);

            if (!landingPad->globOptData.liveVarSyms->Test(id)
                || !fromData->liveVarSyms->Test(id))
            {
                continue;
            }

            Value * landingPadValue = landingPad->globOptData.FindValue(sym);
            if (landingPadValue == nullptr)
            {
                continue;
            }

            Value * loopValue = fromData->FindValue(sym);
            if (loopValue == nullptr)
            {
                continue;
            }

            ValueInfo *landingPadValueInfo = landingPadValue->GetValueInfo();
            ValueInfo *loopValueInfo = loopValue->GetValueInfo();

            if (landingPadValueInfo->IsLikelyString()
                && loopValueInfo->IsLikelyString())
            {
                IR::Instr *cloneStr = IR::Instr::New(Js::OpCode::CloneStr, this->func);
                IR::RegOpnd *opnd = IR::RegOpnd::New(sym, IRType::TyVar, this->func);
                cloneStr->SetDst(opnd);
                cloneStr->SetSrc1(opnd);
                if (loop->bailOutInfo->bailOutInstr)
                {
                    loop->bailOutInfo->bailOutInstr->InsertBefore(cloneStr);
                }
                else
                {
                    landingPad->InsertAfter(cloneStr);
                }
                toData->isTempSrc->Set(id);
            }
        }
        NEXT_BITSET_IN_SPARSEBV;
        tempBv->ClearAll();
    }
}